

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

bool density_tests::detail::
     PutTestObject<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>,_256UL,_128UL>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  double dVar1;
  runtime_type<> type;
  ElementType source;
  runtime_type local_208;
  TestObject<256UL,_128UL> local_200;
  
  dVar1 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (&i_rand->m_rand);
  if (dVar1 < 0.9) {
    TestObject<256UL,_128UL>::TestObject(&local_200);
    density::
    sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::emplace<density_tests::TestObject<256ul,128ul>,density_tests::TestObject<256ul,128ul>>
              ((sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
                *)queue,&local_200);
  }
  else {
    local_208.m_feature_table =
         (tuple_type *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::TestObject<256ul,128ul>>
         ::s_table;
    TestObject<256UL,_128UL>::TestObject(&local_200);
    density::
    sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::dyn_push_copy((sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)queue,&local_208,&local_200);
  }
  TestObject<256UL,_128UL>::~TestObject(&local_200);
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                if (i_rand.get_bool(.9))
                {
                    queue.push(ElementType());
                }
                else
                {
                    auto        type = QUEUE::runtime_type::template make<ElementType>();
                    ElementType source;
                    queue.dyn_push_copy(type, &source);
                }
                return true;
            }